

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::getAttributeEncodedValue(CFIReaderImpl *this,int idx)

{
  long lVar1;
  uchar *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  shared_ptr<const_Assimp::FIValue> sVar4;
  shared_ptr<const_Assimp::FIValue> sVar5;
  shared_ptr<const_Assimp::FIValue> sVar6;
  
  if ((-1 < (int)in_RDX._M_pi) &&
     (lVar1 = *(long *)(CONCAT44(in_register_00000034,idx) + 0x148),
     (int)in_RDX._M_pi <
     (int)((ulong)(*(long *)(CONCAT44(in_register_00000034,idx) + 0x150) - lVar1) >> 4) * 0x38e38e39
     )) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((ulong)in_RDX._M_pi & 0xffffffff) * 0x90);
    (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
         *(_func_int ***)((long)&_Var3._M_pi[8]._vptr__Sp_counted_base + lVar1);
    puVar2 = *(uchar **)((long)&_Var3._M_pi[8]._M_use_count + lVar1);
    (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar2;
    if (puVar2 != (uchar *)0x0) {
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded != '\0') {
        *(int *)(puVar2 + 8) = *(int *)(puVar2 + 8) + 1;
        sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<const_Assimp::FIValue>)
               sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
      }
      LOCK();
      *(int *)(puVar2 + 8) = *(int *)(puVar2 + 8) + 1;
      UNLOCK();
    }
    sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
       (_func_int **)0x0;
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> getAttributeEncodedValue(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return nullptr;
        }
        return attributes[idx].value;
    }